

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack30_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar6 = *(undefined1 (*) [16])(in + 1);
  auVar5 = vpmovsxbd_avx(ZEXT416(0x2010004));
  uVar1 = *in;
  uVar3 = *(ulong *)(in + 5);
  *out = uVar1 & 0x3fffffff;
  uVar2 = in[7];
  auVar4 = vpermi2d_avx512vl(auVar5,auVar6,ZEXT416(uVar1));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar3;
  auVar5 = vpalignr_avx(auVar7,auVar6,0xc);
  auVar7 = vpsllvd_avx2(auVar7,_DAT_0019cab0);
  auVar4 = vpshldvd_avx512_vbmi2(auVar6,auVar4,_DAT_001901f0);
  auVar6 = vpsrlvd_avx2(auVar5,_DAT_00191ba0);
  auVar5._8_4_ = 0x3fffffff;
  auVar5._0_8_ = 0x3fffffff3fffffff;
  auVar5._12_4_ = 0x3fffffff;
  auVar5 = vpandd_avx512vl(auVar4,auVar5);
  auVar4._8_4_ = 0x3ffffc00;
  auVar4._0_8_ = 0x3ffff0003ffffc00;
  auVar4._12_4_ = 0x3ffff000;
  auVar6 = vpternlogq_avx512vl(auVar7,auVar6,auVar4,0xec);
  *(undefined1 (*) [16])(out + 1) = auVar5;
  *(long *)(out + 5) = auVar6._0_8_;
  out[7] = (uVar2 & 0xffff) << 0xe | (uint)(uVar3 >> 0x32);
  return in + 8;
}

Assistant:

const uint32_t *__fastunpack30_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 30);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 28)) << (30 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 26)) << (30 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 24)) << (30 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 22)) << (30 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 20)) << (30 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 18)) << (30 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 16)) << (30 - 16);
  out++;

  return in + 1;
}